

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_106>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_106> *this)

{
  code *pcVar1;
  long *plVar2;
  C_A_T_C_H_T_E_S_T_106 obj;
  SubcommandProgram local_3d0;
  
  SubcommandProgram::SubcommandProgram(&local_3d0);
  local_3d0.super_TApp._vptr_TApp = (_func_int **)&PTR__SubcommandProgram_00212c58;
  pcVar1 = (code *)this->m_testAsMethod;
  plVar2 = (long *)((long)&local_3d0.super_TApp._vptr_TApp + *(long *)&this->field_0x10);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *plVar2 + -1);
  }
  (*pcVar1)(plVar2);
  SubcommandProgram::~SubcommandProgram(&local_3d0);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }